

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::StructuredAssignmentPatternExpression::forDynamicArray
          (Compilation *comp,StructuredAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Type *elementType,SourceRange sourceRange)

{
  char *pcVar1;
  undefined4 uVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  SyntaxNode *this;
  int iVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  Expression *this_00;
  optional<int> value;
  ulong pos0;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  StructuredAssignmentPatternExpression *expr_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *src_00;
  long lVar9;
  ulong hash;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  pair<const_int,_const_slang::ast::Expression_*> *ppVar13;
  bool bVar14;
  size_t i;
  EVP_PKEY_CTX *pEVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  undefined1 auVar20 [16];
  SourceRange SVar21;
  EVP_PKEY_CTX *local_208;
  span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  local_1f8;
  mapped_type expr;
  __extent_storage<18446744073709551615UL> _Stack_1e0;
  locator res;
  void *local_1a0;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_198;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  indexMap;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL> indexSetters;
  undefined4 extraout_var;
  
  indexMap.super_Storage.ptr = (char *)&indexMap;
  src = (EVP_PKEY_CTX *)&indexMap.field_0x90;
  indexMap._144_8_ = 0x3f;
  indexMap._152_8_ = 1;
  indexMap._160_16_ = ZEXT816(0x9543d0);
  indexMap._176_8_ = 0;
  indexMap._184_8_ = 0;
  indexSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
  .data_ = (pointer)indexSetters.
                    super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                    .firstElement;
  local_208 = (EVP_PKEY_CTX *)0x0;
  indexSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
  .len = 0;
  indexSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
  .cap = 4;
  uVar12 = (syntax->items).elements._M_extent._M_extent_value + 1;
  bVar14 = false;
  indexMap.super_Storage._136_8_ = indexMap.super_Storage.ptr;
  if (1 < uVar12) {
    uVar12 = uVar12 >> 1;
    lVar9 = 0;
    bVar14 = false;
    local_208 = (EVP_PKEY_CTX *)0x0;
    do {
      ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar9));
      pSVar3 = *ppSVar8;
      this = *(SyntaxNode **)(pSVar3 + 1);
      pEVar15 = local_208;
      if (this->kind == DefaultPatternKeyExpression) {
        SVar21 = slang::syntax::SyntaxNode::sourceRange(this);
        bVar14 = true;
        ASTContext::addDiag(context,(DiagCode)0xd0007,SVar21);
        src = extraout_RDX;
      }
      else {
        iVar7 = Expression::bind((int)this,(sockaddr *)context,4);
        this_00 = (Expression *)CONCAT44(extraout_var,iVar7);
        bVar6 = Expression::bad(this_00);
        if (bVar6) {
          bVar14 = true;
          src = extraout_RDX_00;
        }
        else if (this_00->kind == DataType) {
          SVar21 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(pSVar3 + 1));
          bVar14 = true;
          ASTContext::addDiag(context,(DiagCode)0xe0007,SVar21);
          src = extraout_RDX_01;
        }
        else {
          value = bindArrayIndexSetter
                            (context,this_00,elementType,*(ExpressionSyntax **)(pSVar3 + 2),
                             &indexMap,
                             &indexSetters.
                              super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                            );
          bVar6 = ASTContext::requirePositive(context,value,this_00->sourceRange);
          src = (EVP_PKEY_CTX *)
                (long)value.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>._M_payload;
          if ((EVP_PKEY_CTX *)
              (long)value.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>._M_payload < local_208) {
            src = local_208;
          }
          pEVar15 = src;
          if (!bVar6) {
            bVar14 = true;
            src = local_208;
            pEVar15 = local_208;
          }
        }
      }
      local_208 = pEVar15;
      lVar9 = lVar9 + 0x30;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)elements.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  if ((EVP_PKEY_CTX *)indexMap._184_8_ == local_208 + 1) {
    SmallVectorBase<const_slang::ast::Expression_*>::reserve
              (&elements.super_SmallVectorBase<const_slang::ast::Expression_*>,
               (size_type)(local_208 + 1));
    pEVar15 = (EVP_PKEY_CTX *)0x0;
    do {
      iVar7 = (int)pEVar15;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (long)iVar7;
      hash = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
      pos0 = hash >> (indexMap._144_1_ & 0x3f);
      local_1f8._M_ptr = (pointer)CONCAT44(local_1f8._M_ptr._4_4_,iVar7);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[hash & 0xff];
      uVar10 = 0;
      uVar12 = pos0;
      do {
        pcVar1 = (char *)(indexMap._160_8_ + uVar12 * 0x10);
        cVar16 = (char)uVar2;
        auVar20[0] = -(*pcVar1 == cVar16);
        cVar17 = (char)((uint)uVar2 >> 8);
        auVar20[1] = -(pcVar1[1] == cVar17);
        cVar18 = (char)((uint)uVar2 >> 0x10);
        auVar20[2] = -(pcVar1[2] == cVar18);
        cVar19 = (char)((uint)uVar2 >> 0x18);
        auVar20[3] = -(pcVar1[3] == cVar19);
        auVar20[4] = -(pcVar1[4] == cVar16);
        auVar20[5] = -(pcVar1[5] == cVar17);
        auVar20[6] = -(pcVar1[6] == cVar18);
        auVar20[7] = -(pcVar1[7] == cVar19);
        auVar20[8] = -(pcVar1[8] == cVar16);
        auVar20[9] = -(pcVar1[9] == cVar17);
        auVar20[10] = -(pcVar1[10] == cVar18);
        auVar20[0xb] = -(pcVar1[0xb] == cVar19);
        auVar20[0xc] = -(pcVar1[0xc] == cVar16);
        auVar20[0xd] = -(pcVar1[0xd] == cVar17);
        auVar20[0xe] = -(pcVar1[0xe] == cVar18);
        auVar20[0xf] = -(pcVar1[0xf] == cVar19);
        uVar11 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
        if (uVar11 != 0) {
          lVar9 = indexMap._168_8_ + uVar12 * 0xf0;
          do {
            iVar4 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
              }
            }
            if (*(int *)(lVar9 + (ulong)(uint)(iVar4 << 4)) == iVar7) {
              ppVar13 = (pair<const_int,_const_slang::ast::Expression_*> *)
                        ((ulong)(uint)(iVar4 << 4) + lVar9);
              goto LAB_0074ef35;
            }
            uVar11 = uVar11 - 1 & uVar11;
          } while (uVar11 != 0);
        }
        if ((*(byte *)(uVar12 * 0x10 + indexMap._160_8_ + 0xf) &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) {
          ppVar13 = (pair<const_int,_const_slang::ast::Expression_*> *)0x0;
          goto LAB_0074ef35;
        }
        lVar9 = uVar12 + uVar10;
        uVar10 = uVar10 + 1;
        uVar12 = lVar9 + 1U & indexMap._152_8_;
      } while (uVar10 <= (ulong)indexMap._152_8_);
      ppVar13 = (pair<const_int,_const_slang::ast::Expression_*> *)0x0;
LAB_0074ef35:
      if (ppVar13 == (pair<const_int,_const_slang::ast::Expression_*> *)0x0) {
        if ((ulong)indexMap._184_8_ < (ulong)indexMap._176_8_) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
          ::nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,int>
                    (&res,(table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                           *)&indexMap.super_Storage.field_0x88,(arrays_type *)&indexMap.field_0x90,
                     pos0,hash,(try_emplace_args_t *)&local_198,(int *)&local_1f8);
          indexMap._184_8_ = indexMap._184_8_ + 1;
          ppVar13 = res.p;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
          ::unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,int>
                    (&res,(table_core<boost::unordered::detail::foa::flat_map_types<int,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<int,void>,std::equal_to<int>,slang::detail::hashing::StackAllocator<std::pair<int_const,slang::ast::Expression_const*>,128ul,16ul>>
                           *)&indexMap.super_Storage.field_0x88,hash,
                     (try_emplace_args_t *)&local_198,(int *)&local_1f8);
          ppVar13 = res.p;
        }
      }
      expr = ppVar13->second;
      SmallVectorBase<slang::ast::Expression_const*>::
      emplace_back<slang::ast::Expression_const*const&>
                ((SmallVectorBase<slang::ast::Expression_const*> *)&elements,&expr);
      pEVar15 = pEVar15 + 1;
      src = extraout_RDX_02;
    } while (pEVar15 <= local_208);
  }
  else if (!bVar14) {
    bVar14 = true;
    ASTContext::addDiag(context,(DiagCode)0x140007,sourceRange);
    src = extraout_RDX_03;
  }
  res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  res.n = 0;
  res._12_4_ = 0;
  expr = (mapped_type)0x0;
  _Stack_1e0._M_extent_value = 0;
  iVar7 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::copy
                    (&indexSetters.
                      super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                     ,(EVP_PKEY_CTX *)comp,src);
  local_1f8._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar7);
  local_1a0 = (void *)0x0;
  iVar7 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (&elements.super_SmallVectorBase<const_slang::ast::Expression_*>,
                     (EVP_PKEY_CTX *)comp,src_00);
  local_198._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar7);
  expr_00 = BumpAllocator::
            emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,18446744073709551615ul>,decltype(nullptr),std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                      (&comp->super_BumpAllocator,type,
                       (span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                        *)&res,(span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                                *)&expr,&local_1f8,&local_1a0,&local_198,&sourceRange);
  if (bVar14) {
    expr_00 = (StructuredAssignmentPatternExpression *)
              Expression::badExpr(comp,(Expression *)expr_00);
  }
  if (elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ !=
      (pointer)elements.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement) {
    operator_delete(elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_);
  }
  if (indexSetters.
      super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>.data_ !=
      (pointer)indexSetters.
               super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
               .firstElement) {
    operator_delete(indexSetters.
                    super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                    .data_);
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  ::delete_((allocator_type)indexMap.super_Storage._136_8_,
            (table_arrays<std::pair<const_int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
             *)&indexMap.field_0x90);
  return (Expression *)expr_00;
}

Assistant:

Expression& StructuredAssignmentPatternExpression::forDynamicArray(
    Compilation& comp, const StructuredAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    bool bad = false;
    SmallMap<int32_t, const Expression*, 8> indexMap;
    SmallVector<IndexSetter, 4> indexSetters;
    size_t maxIndex = 0;

    for (auto item : syntax.items) {
        if (item->key->kind == SyntaxKind::DefaultPatternKeyExpression) {
            context.addDiag(diag::AssignmentPatternDynamicDefault, item->key->sourceRange());
            bad = true;
            continue;
        }

        // The key is either an array index or a data type setter.
        auto& keyExpr = Expression::bind(*item->key, context, ASTFlags::AllowDataType);
        if (keyExpr.bad()) {
            bad = true;
            continue;
        }

        if (keyExpr.kind == ExpressionKind::DataType) {
            context.addDiag(diag::AssignmentPatternDynamicType, item->key->sourceRange());
            bad = true;
            continue;
        }

        auto index = bindArrayIndexSetter(context, keyExpr, elementType, *item->expr, indexMap,
                                          indexSetters);
        if (!context.requirePositive(index, keyExpr.sourceRange)) {
            bad = true;
            continue;
        }

        maxIndex = std::max(maxIndex, size_t(*index));
    }

    SmallVector<const Expression*> elements;
    if (indexMap.size() != maxIndex + 1) {
        if (!bad) {
            context.addDiag(diag::AssignmentPatternMissingElements, sourceRange);
            bad = true;
        }
    }
    else {
        elements.reserve(maxIndex + 1);
        for (size_t i = 0; i <= maxIndex; i++) {
            auto expr = indexMap[int32_t(i)];
            SLANG_ASSERT(expr);
            elements.push_back(expr);
        }
    }

    auto result = comp.emplace<StructuredAssignmentPatternExpression>(
        type, std::span<const MemberSetter>{}, std::span<const TypeSetter>{},
        indexSetters.copy(comp), nullptr, elements.copy(comp), sourceRange);

    if (bad)
        return badExpr(comp, result);

    return *result;
}